

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void quote_pathname(char *dst,char *src,int dstsize)

{
  int local_1c;
  char *pcStack_18;
  int dstsize_local;
  char *src_local;
  char *dst_local;
  
  local_1c = dstsize + -1;
  src_local = dst;
  for (pcStack_18 = src; *pcStack_18 != '\0' && 1 < local_1c; pcStack_18 = pcStack_18 + 1) {
    if (*pcStack_18 == '\\') {
      *src_local = '\\';
      src_local[1] = '/';
      local_1c = local_1c + -2;
      src_local = src_local + 2;
    }
    else {
      if (*pcStack_18 == '/') {
        *src_local = '\\';
        local_1c = local_1c + -1;
        src_local = src_local + 1;
      }
      *src_local = *pcStack_18;
      local_1c = local_1c + -1;
      src_local = src_local + 1;
    }
  }
  *src_local = '\0';
  return;
}

Assistant:

static void
quote_pathname(char       *dst,		// O - Destination string
               const char *src,		// I - Source string
	       int        dstsize)	// I - Size of destination string
{
  dstsize--; // prepare for trailing zero

  while (*src && dstsize > 1) {
    if (*src == '\\') {
      // Convert backslash to forward slash...
      *dst++ = '\\';
      *dst++ = '/';
      dstsize -= 2;
      src ++;
    } else {
      if (*src == '/') {
	*dst++ = '\\';
	dstsize--;
      }
      *dst++ = *src++;
      dstsize--;
    }
  }

  *dst = '\0';
}